

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_addsub.h
# Opt level: O2

uint32_t helper_ssub16_aarch64(uint32_t a,uint32_t b,void *gep)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  uVar2 = (int)(short)a - (int)(short)b;
  iVar1 = (int)~uVar2 >> 0x1f;
  iVar4 = ((int)a >> 0x10) - ((int)b >> 0x10);
  iVar3 = iVar1 * -3 + 0xc;
  if (iVar4 < 0) {
    iVar3 = iVar1 * -3;
  }
  *(int *)gep = iVar3;
  return uVar2 & 0xffff | iVar4 * 0x10000;
}

Assistant:

uint32_t HELPER(glue(PFX,sub16))(uint32_t a, uint32_t b GE_ARG)
{
    uint32_t res = 0;
    DECLARE_GE;

    SUB16(a, b, 0);
    SUB16(a >> 16, b >> 16, 1);
    SET_GE;
    return res;
}